

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

void __thiscall
duckdb_snappy::internal::WorkingMemory::WorkingMemory(WorkingMemory *this,size_t input_size)

{
  long lVar1;
  uint32_t uVar2;
  unsigned_long *puVar3;
  size_t sVar4;
  char *pcVar5;
  long *in_RDI;
  size_t table_size;
  size_t max_fragment_size;
  allocator<char> *__n;
  new_allocator<char> *in_stack_ffffffffffffffc0;
  allocator<char> local_21;
  ulong local_20;
  size_t local_18;
  unsigned_long local_10 [2];
  
  puVar3 = std::min<unsigned_long>(local_10,&kBlockSize);
  local_18 = *puVar3;
  uVar2 = anon_unknown_3::CalculateTableSize(0x73f43a);
  local_20 = (ulong)uVar2;
  lVar1 = local_18 + local_20 * 2;
  sVar4 = MaxCompressedLength(local_18);
  in_RDI[1] = lVar1 + sVar4;
  __n = &local_21;
  std::allocator<char>::allocator();
  pcVar5 = __gnu_cxx::new_allocator<char>::allocate(in_stack_ffffffffffffffc0,(size_type)__n,in_RDI)
  ;
  *in_RDI = (long)pcVar5;
  std::allocator<char>::~allocator(&local_21);
  in_RDI[2] = *in_RDI;
  in_RDI[3] = *in_RDI + local_20 * 2;
  in_RDI[4] = in_RDI[3] + local_18;
  return;
}

Assistant:

WorkingMemory::WorkingMemory(size_t input_size) {
  const size_t max_fragment_size = std::min(input_size, kBlockSize);
  const size_t table_size = CalculateTableSize(max_fragment_size);
  size_ = table_size * sizeof(*table_) + max_fragment_size +
          MaxCompressedLength(max_fragment_size);
  mem_ = std::allocator<char>().allocate(size_);
  table_ = reinterpret_cast<uint16_t*>(mem_);
  input_ = mem_ + table_size * sizeof(*table_);
  output_ = input_ + max_fragment_size;
}